

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O0

Spectrum __thiscall CMU462::PathTracer::raytrace_pixel(PathTracer *this,size_t x,size_t y)

{
  int iVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined4 uVar5;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined4 uVar10;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  Spectrum SVar12;
  int i;
  Spectrum temp;
  double a2;
  double a1;
  Vector2D p_1;
  Vector2D p;
  size_t h;
  size_t w;
  int num_samples;
  Spectrum result;
  Ray *in_stack_000002f8;
  PathTracer *in_stack_00000300;
  undefined8 in_stack_fffffffffffffe08;
  Spectrum *in_stack_fffffffffffffe10;
  Spectrum local_1d0;
  Spectrum local_1bc;
  Spectrum local_1b0 [10];
  Spectrum local_130;
  double local_120;
  double dStack_118;
  int local_10c;
  Spectrum local_108;
  double local_f8;
  double local_f0;
  Vector2D local_e8;
  Spectrum local_d0 [10];
  float local_50 [2];
  double in_stack_ffffffffffffffb8;
  double x_00;
  Camera *this_00;
  Spectrum local_c;
  
  iVar1 = (int)*(undefined8 *)(in_RDI + 0x20);
  this_00 = *(Camera **)(in_RDI + 0x90);
  x_00 = *(double *)(in_RDI + 0x98);
  uVar5 = (undefined4)((ulong)in_RSI >> 0x20);
  uVar10 = (undefined4)((ulong)in_RDX >> 0x20);
  if (iVar1 == 1) {
    auVar2._8_4_ = uVar5;
    auVar2._0_8_ = in_RSI;
    auVar2._12_4_ = 0x45300000;
    auVar6._8_4_ = (int)((ulong)this_00 >> 0x20);
    auVar6._0_8_ = this_00;
    auVar6._12_4_ = 0x45300000;
    auVar7._8_4_ = uVar10;
    auVar7._0_8_ = in_RDX;
    auVar7._12_4_ = 0x45300000;
    auVar11._8_4_ = (int)((ulong)x_00 >> 0x20);
    auVar11._0_8_ = x_00;
    auVar11._12_4_ = 0x45300000;
    Vector2D::Vector2D((Vector2D *)&local_d0[10].b,
                       ((auVar2._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)in_RSI) - 4503599627370496.0) + 0.5) /
                       ((auVar6._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)this_00) - 4503599627370496.0)),
                       ((auVar7._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)in_RDX) - 4503599627370496.0) + 0.5) /
                       ((auVar11._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,SUB84(x_00,0)) - 4503599627370496.0)));
    Camera::generate_ray(this_00,x_00,in_stack_ffffffffffffffb8);
    SVar12 = trace_ray(in_stack_00000300,in_stack_000002f8);
    local_d0[0]._0_8_ = SVar12._0_8_;
    local_c.r = local_d0[0].r;
    local_c.g = local_d0[0].g;
    local_d0[0].b = SVar12.b;
    local_c.b = local_d0[0].b;
  }
  else {
    Vector2D::Vector2D(&local_e8);
    Spectrum::Spectrum(&local_c,0.0,0.0,0.0);
    Spectrum::Spectrum(&local_108,0.0,0.0,0.0);
    for (local_10c = 0; local_10c < iVar1; local_10c = local_10c + 1) {
      (**(code **)(**(long **)(in_RDI + 0x80) + 0x10))(&local_120);
      local_e8.x = local_120;
      local_e8.y = dStack_118;
      auVar3._8_4_ = uVar5;
      auVar3._0_8_ = in_RSI;
      auVar3._12_4_ = 0x45300000;
      auVar8._8_4_ = (int)((ulong)this_00 >> 0x20);
      auVar8._0_8_ = this_00;
      auVar8._12_4_ = 0x45300000;
      local_f0 = ((auVar3._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)in_RSI) - 4503599627370496.0) + local_120) /
                 ((auVar8._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)this_00) - 4503599627370496.0));
      auVar4._8_4_ = uVar10;
      auVar4._0_8_ = in_RDX;
      auVar4._12_4_ = 0x45300000;
      auVar9._8_4_ = (int)((ulong)x_00 >> 0x20);
      auVar9._0_8_ = x_00;
      auVar9._12_4_ = 0x45300000;
      local_f8 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)in_RDX) - 4503599627370496.0) + dStack_118) /
                 ((auVar9._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,SUB84(x_00,0)) - 4503599627370496.0));
      Camera::generate_ray(this_00,x_00,in_stack_ffffffffffffffb8);
      SVar12 = trace_ray(in_stack_00000300,in_stack_000002f8);
      local_1b0[0].b = SVar12.b;
      local_130.b = local_1b0[0].b;
      local_1b0[0]._0_8_ = SVar12._0_8_;
      local_130.r = local_1b0[0].r;
      local_130.g = local_1b0[0].g;
      local_108.b = local_1b0[0].b;
      local_108.r = local_1b0[0].r;
      local_108.g = local_1b0[0].g;
      local_1b0[0] = SVar12;
      Spectrum::clampRGB(in_stack_fffffffffffffe10,(float)((ulong)in_stack_fffffffffffffe08 >> 0x20)
                        );
      SVar12 = Spectrum::operator*(in_stack_fffffffffffffe10,
                                   (float)((ulong)in_stack_fffffffffffffe08 >> 0x20));
      local_1d0._0_8_ = SVar12._0_8_;
      local_1bc.r = local_1d0.r;
      local_1bc.g = local_1d0.g;
      local_1d0.b = SVar12.b;
      local_1bc.b = local_1d0.b;
      Spectrum::operator+=(&local_c,&local_1bc);
    }
  }
  SVar12.b = local_c.b;
  SVar12.r = local_c.r;
  SVar12.g = local_c.g;
  return SVar12;
}

Assistant:

Spectrum PathTracer::raytrace_pixel(size_t x, size_t y) {
	// TODO (PathTracer):
	// Sample the pixel with coordinate (x,y) and return the result spectrum.
	// The sample rate is given by the number of camera rays per pixel.

	int num_samples = ns_aa;

	size_t w = sampleBuffer.w;
	size_t h = sampleBuffer.h;

	if (num_samples == 1) {
		Vector2D p = Vector2D((double(x)+0.5) / w, (double(y)+0.5) / h);
		return trace_ray(camera->generate_ray(p.x-0.5, p.y-0.5));
	}
	else {
		Vector2D p;
		double a1, a2;
		Spectrum result(0, 0, 0);
		Spectrum temp;
		for (int i = 0; i < num_samples; i++) {
			p = gridSampler->get_sample();
			a1 = (double(x) + p.x) / w;
			a2 = (double(y) + p.y) / h;
			temp = trace_ray(camera->generate_ray(a1 - 0.5, a2 - 0.5));
			temp.clampRGB(10.0);
			result += temp * (1.0 / num_samples);
		}
		return result;
	}
}